

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvidiamon.cpp
# Opt level: O3

void __thiscall
nvidiamon::update_stats(nvidiamon *this,vector<int,_std::allocator<int>_> *pids,string *read_path)

{
  _Rb_tree_header *p_Var1;
  level_enum lVar2;
  int *piVar3;
  _Hash_node_base *p_Var4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  istream *piVar8;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  long *plVar12;
  undefined8 *puVar13;
  uint uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  uint uVar17;
  pointer pbVar18;
  int iVar19;
  nvidiamon *this_00;
  bool bVar20;
  __node_base *p_Var21;
  uint uVar22;
  pointer pbVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  uint __len;
  long lVar24;
  int *piVar25;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  uint gpu_idx;
  pid_t pid;
  uint fb_mem;
  uint mem;
  uint sm;
  string cg_type;
  string ofa;
  string jpg;
  string dec;
  string enc;
  string cmd_name;
  string ccpm;
  stringstream strm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  istringstream instr;
  key_type local_55c;
  nvidiamon *local_558;
  int local_550;
  int local_54c;
  uint local_548;
  uint local_544;
  char *local_540;
  long local_538;
  char local_530 [16];
  char *local_520;
  long local_518;
  char local_510 [16];
  char *local_500;
  long local_4f8;
  char local_4f0 [16];
  char *local_4e0;
  long local_4d8;
  char local_4d0 [16];
  __node_base *local_4c0;
  long local_4b8;
  __node_base local_4b0 [2];
  ios_base *local_4a0;
  MessageBase *local_498;
  uint local_490;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  _Rb_tree_node_base *local_470;
  string local_468;
  char *local_448;
  long local_440;
  char local_438 [16];
  char *local_428;
  long local_420;
  char local_418 [16];
  pointer local_408;
  vector<int,_std::allocator<int>_> *local_400;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_3f8;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3b0;
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined1 *local_380 [2];
  undefined1 local_370 [16];
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined1 *local_320 [2];
  undefined1 local_310 [216];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
  local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  string local_1d8;
  undefined1 local_1b8 [32];
  byte abStack_198 [88];
  ios_base local_140 [272];
  
  local_558 = this;
  local_400 = pids;
  local_3c0._0_8_ = &aStack_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"nvidia-smi","");
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"pmon","");
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"-s","");
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"um","");
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"-c","");
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"1","");
  __l._M_len = 6;
  __l._M_array = (iterator)local_3c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f0,__l,(allocator_type *)local_1b8);
  lVar24 = 0;
  do {
    if (local_310 + lVar24 != *(undefined1 **)((long)local_320 + lVar24)) {
      operator_delete(*(undefined1 **)((long)local_320 + lVar24));
    }
    lVar24 = lVar24 + -0x20;
  } while (lVar24 != -0xc0);
  local_238._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_238._M_impl.super__Rb_tree_header._M_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_238._M_impl._0_8_ = 0;
  local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_238._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_238._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = (local_558->nvidia_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(local_558->nvidia_stats)._M_t._M_impl.super__Rb_tree_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_right =
       local_238._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                             *)&local_238,(key_type *)(p_Var6 + 1));
      *pmVar5 = 0;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  local_490 = 0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_470 = &p_Var1->_M_header;
  if (read_path->_M_string_length == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_208,&local_1f0);
    prmon::cmd_pipe_output
              ((pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_3c0,&local_208);
    local_490 = local_3c0._0_4_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_488,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_3c0 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3c0 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_208);
    if (local_490 == 0) goto LAB_0018fdbf;
    uVar22 = -local_490;
    if (0 < (int)local_490) {
      uVar22 = local_490;
    }
    __len = 1;
    if (9 < uVar22) {
      uVar16 = (ulong)uVar22;
      uVar17 = 4;
      do {
        __len = uVar17;
        uVar14 = (uint)uVar16;
        if (uVar14 < 100) {
          __len = __len - 2;
          goto LAB_00190bd1;
        }
        if (uVar14 < 1000) {
          __len = __len - 1;
          goto LAB_00190bd1;
        }
        if (uVar14 < 10000) goto LAB_00190bd1;
        uVar16 = uVar16 / 10000;
        uVar17 = __len + 4;
      } while (99999 < uVar14);
      __len = __len + 1;
    }
LAB_00190bd1:
    uVar17 = local_490 >> 0x1f;
    local_3f8._M_buckets = &local_3f8._M_before_begin._M_nxt;
    std::__cxx11::string::_M_construct
              ((ulong)&local_3f8,(char)__len - (char)((int)local_490 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_3f8._M_buckets + (ulong)uVar17),__len,uVar22);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_3f8,0,(char *)0x0,0x198b64);
    pbVar23 = (pointer)(plVar12 + 2);
    if ((pointer)*plVar12 == pbVar23) {
      local_1b8._16_8_ = (pbVar23->_M_dataplus)._M_p;
      local_1b8._24_8_ = plVar12[3];
      local_1b8._0_8_ = (pointer)(local_1b8 + 0x10);
    }
    else {
      local_1b8._16_8_ = (pbVar23->_M_dataplus)._M_p;
      local_1b8._0_8_ = (pointer)*plVar12;
    }
    local_1b8._8_8_ = plVar12[1];
    *plVar12 = (long)pbVar23;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append(local_1b8);
    local_558 = (nvidiamon *)&local_558->super_MessageBase;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 == paVar15) {
      aStack_3b0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      aStack_3b0._8_8_ = puVar13[3];
      local_3c0._0_8_ = &aStack_3b0;
    }
    else {
      aStack_3b0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_3c0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar13;
    }
    local_3c0._8_8_ = puVar13[1];
    *puVar13 = paVar15;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    MessageBase::error((MessageBase *)local_558,(string *)local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._0_8_ != &aStack_3b0) {
      operator_delete((void *)local_3c0._0_8_);
    }
    if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_);
    }
    p_Var21 = (__node_base *)local_3f8._M_buckets;
    if ((__node_base *)local_3f8._M_buckets == &local_3f8._M_before_begin) goto LAB_00190b8f;
  }
  else {
    this_00 = (nvidiamon *)(read_path->_M_dataplus)._M_p;
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,this_00,
               (pointer)((long)&(this_00->super_Imonitor)._vptr_Imonitor +
                        read_path->_M_string_length));
    read_gpu_stats_test((pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_3c0,this_00,&local_1d8);
    local_1b8._16_8_ =
         local_488.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8._8_8_ =
         local_488.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1b8._0_8_ =
         local_488.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_490 = local_3c0._0_4_;
    local_488.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aStack_3b0._8_8_;
    local_488.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3c0._8_8_;
    local_488.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)aStack_3b0._M_allocated_capacity;
    local_3c0._8_8_ = (pointer)0x0;
    aStack_3b0._M_allocated_capacity = 0;
    aStack_3b0._8_8_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3c0 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
LAB_0018fdbf:
    local_498 = &local_558->super_MessageBase;
    if ((int)(local_558->super_MessageBase).log_level < 2) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aStack_3b0._M_local_buf,
                 "nvidiamon::update_stats got the following output (",0x32);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&aStack_3b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"): ",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pbVar23 = local_488.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_488.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_488.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar19 = 0;
        pbVar18 = local_488.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)aStack_3b0._M_local_buf,iVar19);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," -> ",4);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(pbVar18->_M_dataplus)._M_p,pbVar18->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar19 = iVar19 + 1;
          pbVar18 = pbVar18 + 1;
        } while (pbVar18 != pbVar23);
      }
      std::__cxx11::stringbuf::str();
      MessageBase::debug(local_498,(string *)local_1b8);
      if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
      std::ios_base::~ios_base((ios_base *)local_340);
    }
    local_55c = 0;
    local_544 = 0;
    local_548 = 0;
    local_54c = 0;
    local_550 = 0;
    local_4c0 = local_4b0;
    local_4b8 = 0;
    local_4b0[0]._M_nxt._0_1_ = 0;
    local_4e0 = local_4d0;
    local_4d8 = 0;
    local_4d0[0] = '\0';
    local_500 = local_4f0;
    local_4f8 = 0;
    local_4f0[0] = '\0';
    local_520 = local_510;
    local_518 = 0;
    local_510[0] = '\0';
    local_540 = local_530;
    local_538 = 0;
    local_530[0] = '\0';
    local_428 = local_418;
    local_420 = 0;
    local_418[0] = '\0';
    local_448 = local_438;
    local_440 = 0;
    local_438[0] = '\0';
    local_3f8._M_buckets = &local_3f8._M_single_bucket;
    local_3f8._M_bucket_count = 1;
    local_3f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_3f8._M_element_count = 0;
    local_3f8._M_rehash_policy._M_max_load_factor = 1.0;
    local_3f8._M_rehash_policy._4_4_ = 0;
    local_3f8._M_rehash_policy._M_next_resize = 0;
    local_3f8._M_single_bucket = (__node_base_ptr)0x0;
    if (local_488.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_488.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_4a0 = (ios_base *)local_340;
      local_408 = local_488.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pbVar18 = local_488.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar23 = local_488.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (*(pbVar18->_M_dataplus)._M_p != '#') {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_1b8,(string *)pbVar18,_S_in);
          piVar8 = std::istream::_M_extract<unsigned_int>((uint *)local_1b8);
          piVar8 = (istream *)std::istream::operator>>(piVar8,&local_550);
          piVar8 = std::operator>>(piVar8,(string *)&local_540);
          piVar8 = std::istream::_M_extract<unsigned_int>((uint *)piVar8);
          piVar8 = std::istream::_M_extract<unsigned_int>((uint *)piVar8);
          piVar8 = std::operator>>(piVar8,(string *)&local_4c0);
          piVar8 = std::operator>>(piVar8,(string *)&local_4e0);
          piVar8 = std::operator>>(piVar8,(string *)&local_500);
          piVar8 = std::operator>>(piVar8,(string *)&local_520);
          piVar8 = std::istream::_M_extract<unsigned_int>((uint *)piVar8);
          piVar8 = std::operator>>(piVar8,(string *)&local_428);
          std::operator>>(piVar8,(string *)&local_448);
          lVar2 = (local_558->super_MessageBase).log_level;
          if ((abStack_198[*(long *)(local_1b8._0_8_ + -0x18)] & 5) == 0) {
            if ((int)lVar2 < 2) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)aStack_3b0._M_local_buf,"Good read: ",0xb);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&aStack_3b0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,local_550);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,local_540,local_538);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(char *)local_4c0,local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,local_4e0,local_4d8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,local_500,local_4f8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,local_520,local_518);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,local_428,local_420);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,local_448,local_440);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              MessageBase::debug(local_498,&local_468);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_468._M_dataplus._M_p != &local_468.field_2) {
                operator_delete(local_468._M_dataplus._M_p);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
              std::ios_base::~ios_base(local_4a0);
            }
            piVar3 = (local_400->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            for (piVar25 = (local_400->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start; pbVar23 = local_408,
                p_Var11 = local_470, piVar25 != piVar3; piVar25 = piVar25 + 1) {
              if (*piVar25 == local_550) {
                uVar16 = (ulong)local_544;
                local_3c0._0_8_ = &aStack_3b0;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"gpusmpct","");
                pmVar5 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                       *)&local_238,(key_type *)local_3c0);
                *pmVar5 = *pmVar5 + uVar16;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c0._0_8_ != &aStack_3b0) {
                  operator_delete((void *)local_3c0._0_8_);
                }
                uVar16 = (ulong)local_548;
                local_3c0._0_8_ = &aStack_3b0;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"gpumempct","");
                pmVar5 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                       *)&local_238,(key_type *)local_3c0);
                *pmVar5 = *pmVar5 + uVar16;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c0._0_8_ != &aStack_3b0) {
                  operator_delete((void *)local_3c0._0_8_);
                }
                uVar22 = local_558->MB_to_KB * local_54c;
                local_3c0._0_8_ = &aStack_3b0;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"gpufbmem","");
                pmVar5 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                       *)&local_238,(key_type *)local_3c0);
                *pmVar5 = *pmVar5 + (ulong)uVar22;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c0._0_8_ != &aStack_3b0) {
                  operator_delete((void *)local_3c0._0_8_);
                }
                if (((__node_base *)
                    (local_3f8._M_buckets + (ulong)local_55c % local_3f8._M_bucket_count))->_M_nxt
                    != (_Hash_node_base *)0x0) {
                  p_Var4 = ((__node_base *)
                           (local_3f8._M_buckets + (ulong)local_55c % local_3f8._M_bucket_count))->
                           _M_nxt->_M_nxt;
                  uVar22 = *(uint *)&p_Var4[1]._M_nxt;
                  do {
                    if (local_55c == uVar22) goto LAB_00190940;
                    p_Var4 = p_Var4->_M_nxt;
                  } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                          (uVar22 = *(uint *)&p_Var4[1]._M_nxt,
                          (ulong)uVar22 % local_3f8._M_bucket_count ==
                          (ulong)local_55c % local_3f8._M_bucket_count));
                }
                local_3c0._0_8_ = &aStack_3b0;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"ngpus","");
                pmVar5 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                       *)&local_238,(key_type *)local_3c0);
                *pmVar5 = *pmVar5 + 1;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c0._0_8_ != &aStack_3b0) {
                  operator_delete((void *)local_3c0._0_8_);
                }
                pmVar9 = std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_3f8,&local_55c);
                *pmVar9 = true;
              }
LAB_00190940:
            }
            for (p_Var10 = (local_558->nvidia_stats)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left; p_Var10 != p_Var11;
                p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                                     *)&local_238,(key_type *)(p_Var10 + 1));
              prmon::monitored_value::set_value((monitored_value *)(p_Var10 + 2),*pmVar5);
            }
          }
          else if ((int)lVar2 < 2) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)aStack_3b0._M_local_buf,"Bad read of line: ",0x12);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)aStack_3b0._M_local_buf,(pbVar18->_M_dataplus)._M_p,
                                pbVar18->_M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)aStack_3b0._M_local_buf,"Parsed to: ",0xb);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&aStack_3b0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,local_550);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_540,local_538);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_4c0,local_4b8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_4e0,local_4d8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_500,local_4f8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_520,local_518);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_428,local_420);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_448,local_440);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)aStack_3b0._M_local_buf,"StringStream status: good()=",0x1c);
            bVar20 = SUB81(&aStack_3b0,0);
            std::ostream::_M_insert<bool>(bVar20);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)aStack_3b0._M_local_buf," eof()=",7);
            std::ostream::_M_insert<bool>(bVar20);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)aStack_3b0._M_local_buf," fail()=",8);
            std::ostream::_M_insert<bool>(bVar20);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)aStack_3b0._M_local_buf," bad()=",7);
            poVar7 = std::ostream::_M_insert<bool>(bVar20);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            MessageBase::debug(local_498,&local_468);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_dataplus._M_p != &local_468.field_2) {
              operator_delete(local_468._M_dataplus._M_p);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
            std::ios_base::~ios_base(local_4a0);
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)local_1b8);
          std::ios_base::~ios_base(local_140);
        }
        pbVar18 = pbVar18 + 1;
      } while (pbVar18 != pbVar23);
    }
    if ((int)(local_558->super_MessageBase).log_level < 2) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aStack_3b0._M_local_buf,"Parsed: ",8);
      p_Var11 = (local_558->nvidia_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var11 != local_470) {
        do {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)aStack_3b0._M_local_buf,*(char **)(p_Var11 + 1),
                              (long)p_Var11[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
          poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != local_470);
      }
      std::__cxx11::stringbuf::str();
      MessageBase::debug(local_498,(string *)local_1b8);
      if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
      std::ios_base::~ios_base((ios_base *)local_340);
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_3f8);
    if (local_448 != local_438) {
      operator_delete(local_448);
    }
    if (local_428 != local_418) {
      operator_delete(local_428);
    }
    if (local_540 != local_530) {
      operator_delete(local_540);
    }
    if (local_520 != local_510) {
      operator_delete(local_520);
    }
    if (local_500 != local_4f0) {
      operator_delete(local_500);
    }
    if (local_4e0 != local_4d0) {
      operator_delete(local_4e0);
    }
    p_Var21 = local_4c0;
    if (local_4c0 == local_4b0) goto LAB_00190b8f;
  }
  operator_delete(p_Var21);
LAB_00190b8f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_488);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
  ::~_Rb_tree(&local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f0);
  return;
}

Assistant:

void nvidiamon::update_stats(const std::vector<pid_t>& pids,
                             const std::string read_path) {
  const std::vector<std::string> cmd = {"nvidia-smi", "pmon", "-s",
                                        "um",         "-c",   "1"};
  prmon::monitored_value_map nvidia_stats_update{};
  for (const auto& value : nvidia_stats) nvidia_stats_update[value.first] = 0L;

  std::pair<int, std::vector<std::string>> cmd_result;
  if (read_path.size()) {
    cmd_result = read_gpu_stats_test(read_path);
  } else {
    cmd_result = prmon::cmd_pipe_output(cmd);
    if (cmd_result.first) {
      // Failed
      error("Failed to execute 'nvidia-smi' to get GPU status (code " +
            std::to_string(cmd_result.first) + ")");
      return;
    }
  }
  if (log_level <= spdlog::level::debug) {
    std::stringstream strm;
    strm << "nvidiamon::update_stats got the following output ("
         << cmd_result.second.size() << "): " << std::endl;
    int i = 0;
    for (const auto& s : cmd_result.second) {
      strm << i << " -> " << s << std::endl;
      ++i;
    }
    debug(strm.str());
  }

  // Loop over output
  unsigned int gpu_idx{}, sm{}, mem{}, fb_mem{};
  pid_t pid{};
  std::string enc{}, dec{}, jpg{}, ofa{}, cg_type{}, ccpm{}, cmd_name{};
  std::unordered_map<unsigned int, bool>
      activegpus{};  // Avoid double counting active GPUs
  for (const auto& s : cmd_result.second) {
    if (s[0] == '#') continue;
    std::istringstream instr(s);
    instr >> gpu_idx >> pid >> cg_type >> sm >> mem >> enc >> dec >> jpg >> ofa >> fb_mem >>
          ccpm  >> cmd_name;
    auto read_ok = !(instr.fail() || instr.bad());  // eof() is ok
    if (read_ok) {
      if (log_level <= spdlog::level::debug) {
        std::stringstream strm;
        strm << "Good read: " << gpu_idx << " " << pid << " " << cg_type << " "
             << sm << " " << mem << " " << enc << " " << dec << " " << jpg << " " << ofa << " " << fb_mem << " " << ccpm
             << " " << cmd_name << std::endl;
        debug(strm.str());
      }

      // Filter on PID value, so we only add stats for our processes
      for (auto const p : pids) {
        if (p == pid) {
          nvidia_stats_update["gpusmpct"] += sm;
          nvidia_stats_update["gpumempct"] += mem;
          nvidia_stats_update["gpufbmem"] += fb_mem * MB_to_KB;
          if (!activegpus.count(gpu_idx)) {
            ++nvidia_stats_update["ngpus"];
            activegpus[gpu_idx] = true;
          }
        }
      }

      // Now move summed stats to the persistent counters
      for (auto& value : nvidia_stats) {
        value.second.set_value(nvidia_stats_update[value.first]);
      }
    } else if (log_level <= spdlog::level::debug) {
      std::stringstream strm;
      strm << "Bad read of line: " << s << std::endl;
      strm << "Parsed to: " << gpu_idx << " " << pid << " " << cg_type << " "
           << sm << " " << mem << " " << enc << " " << dec << " " << jpg << " " << ofa << " " << fb_mem << " " << ccpm
           << " " << cmd_name << std::endl;

      strm << "StringStream status: good()=" << instr.good();
      strm << " eof()=" << instr.eof();
      strm << " fail()=" << instr.fail();
      strm << " bad()=" << instr.bad() << std::endl;
      debug(strm.str());
    }
  }

  if (log_level <= spdlog::level::debug) {
    std::stringstream strm;
    strm << "Parsed: ";
    for (const auto& value : nvidia_stats) {
      strm << value.first << ": " << value.second.get_value() << ";";
    }
    debug(strm.str());
  }
}